

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O0

ssize_t __thiscall lan::db::str_find_first_of(db *this,string *target,string *content,size_t spoint)

{
  char target_00;
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  string local_88;
  string local_58;
  ulong local_38;
  register_t i;
  size_t spoint_local;
  string *content_local;
  string *target_local;
  db *this_local;
  
  local_38 = spoint;
  i = spoint;
  spoint_local = (size_t)content;
  content_local = target;
  target_local = (string *)this;
  while( true ) {
    uVar1 = local_38;
    uVar3 = std::__cxx11::string::length();
    if (uVar3 <= uVar1) {
      return -1;
    }
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)content);
    if (*pcVar4 == '\"') {
      std::__cxx11::string::string((string *)&local_58,(string *)content);
      local_38 = str_get_str_end(this,&local_58,local_38 + 1);
      std::__cxx11::string::~string((string *)&local_58);
    }
    lVar5 = std::__cxx11::string::data();
    target_00 = *(char *)(local_38 + lVar5);
    std::__cxx11::string::string((string *)&local_88,(string *)target);
    bVar2 = str_compare(this,target_00,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    if (bVar2) break;
    local_38 = local_38 + 1;
  }
  return local_38;
}

Assistant:

ssize_t db::str_find_first_of(std::string const target, const std::string content, size_t spoint){
            for(register_t i = spoint ; i < content.length() ; i ++){
                if(content[i] == '\"')
                    i = str_get_str_end(content, i+1);
                if(str_compare(content.data()[i] ,target))
                    return i;
            } return -1;
        }